

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_null(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint __fd;
  undefined8 uVar4;
  ulong __n;
  void *__s1;
  void *__s2;
  undefined8 uVar5;
  long *plVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong unaff_R12;
  undefined **ppuVar15;
  undefined8 *unaff_R13;
  void *unaff_R14;
  char *unaff_R15;
  bson_t b;
  bson_error_t error;
  code **ppcVar16;
  undefined4 uStack_125c;
  undefined8 uStack_1258;
  undefined2 uStack_1250;
  int iStack_1248;
  int iStack_1244;
  char acStack_1240 [504];
  code *pcStack_1048;
  undefined1 auStack_1038 [512];
  char *pcStack_e38;
  code *pcStack_e30;
  int iStack_e20;
  int iStack_e1c;
  char acStack_e18 [504];
  long *plStack_c20;
  ulong uStack_c18;
  char *pcStack_c10;
  code *pcStack_c08;
  long lStack_b90;
  long lStack_b88;
  undefined1 auStack_b80 [128];
  undefined1 auStack_b00 [232];
  undefined1 auStack_a18 [608];
  long *plStack_7b8;
  code *pcStack_7b0;
  undefined1 auStack_7a8 [8];
  char acStack_7a0 [16];
  char *pcStack_790;
  code *pcStack_788;
  uint uStack_704;
  undefined8 uStack_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 auStack_638 [648];
  code *pcStack_388;
  undefined1 auStack_380 [240];
  undefined1 local_290 [648];
  
  pcStack_388 = (code *)0x132f2a;
  cVar1 = bson_init_from_json(auStack_380,"{ \"x\": null }",0xffffffffffffffff,local_290);
  if (cVar1 == '\0') {
    pcStack_388 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_388 = (code *)0x132f33;
    uVar4 = bson_bcone_magic();
    pcStack_388 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_380,"x",uVar4,9,0);
    if (cVar1 != '\0') {
      pcStack_388 = (code *)0x132f5b;
      bson_destroy(auStack_380);
      return;
    }
  }
  pcStack_388 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_788 = (code *)0x0;
  pcStack_790 = "}";
  acStack_7a0[8] = -0x52;
  acStack_7a0[9] = '/';
  acStack_7a0[10] = '\x13';
  acStack_7a0[0xb] = '\0';
  acStack_7a0[0xc] = '\0';
  acStack_7a0[0xd] = '\0';
  acStack_7a0[0xe] = '\0';
  acStack_7a0[0xf] = '\0';
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  __n = bcon_new(0,"a","{","b","{");
  uStack_690 = 0;
  uStack_688 = 0;
  uStack_6a0 = 0;
  uStack_698 = 0;
  uStack_6b0 = 0;
  uStack_6a8 = 0;
  uStack_6c0 = 0;
  uStack_6b8 = 0;
  uStack_6d0 = 0;
  uStack_6c8 = 0;
  uStack_6e0 = 0;
  uStack_6d8 = 0;
  uStack_6f0 = 0;
  uStack_6e8 = 0;
  uStack_700 = 0x500000003;
  uStack_6f8 = 5;
  pcStack_788 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_700,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_638);
  if (cVar1 != '\0') {
    pcStack_788 = (code *)0x133023;
    unaff_R15 = (char *)bson_get_data(&uStack_700);
    pcStack_788 = (code *)0x13302e;
    unaff_R14 = (void *)bson_get_data(__n);
    if (*(int *)(__n + 4) == uStack_700._4_4_) {
      pcStack_788 = (code *)0x133043;
      __s1 = (void *)bson_get_data(__n);
      pcStack_788 = (code *)0x133053;
      __s2 = (void *)bson_get_data(&uStack_700);
      pcStack_788 = (code *)0x133061;
      iVar2 = bcmp(__s1,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        pcStack_788 = (code *)0x133072;
        bson_destroy(&uStack_700);
        pcStack_788 = (code *)0x13307a;
        bson_destroy(__n);
        return;
      }
    }
    unaff_R13 = &uStack_700;
    pcStack_788 = (code *)0x13309b;
    uVar4 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_788 = (code *)0x1330a8;
    uVar5 = bson_as_canonical_extended_json(__n);
    uVar12 = 0xffffffff;
    if (uStack_700._4_4_ != 0) {
      uVar13 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar13) break;
        if (unaff_R15[uVar13] != *(char *)((long)unaff_R14 + uVar13)) {
          uVar12 = uVar13 & 0xffffffff;
          break;
        }
        uVar13 = uVar13 + 1;
      } while (uStack_700._4_4_ != (uint)uVar13);
    }
    if ((int)uVar12 == -1) {
      uVar3 = uStack_700._4_4_;
      if (uStack_700._4_4_ < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar12 = (ulong)(uVar3 - 1);
    }
    pcStack_788 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar12,uVar4,uVar5);
    pcStack_788 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R12 = (ulong)uVar3;
    pcStack_788 = (code *)0x133136;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    uStack_704 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_788 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_788 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_788 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      unaff_R13 = (undefined8 *)(ulong)__fd;
      if (__fd == 0xffffffff) goto LAB_0013318c;
      unaff_R12 = uStack_700 >> 0x20;
      pcStack_788 = (code *)0x133160;
      uVar12 = write(uVar3,unaff_R15,unaff_R12);
      if (uVar12 != unaff_R12) goto LAB_00133191;
      __n = (ulong)*(uint *)(__n + 4);
      pcStack_788 = (code *)0x133176;
      uVar12 = write(__fd,unaff_R14,__n);
      if (uVar12 == __n) {
        pcStack_788 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_788 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_788 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar7 = acStack_7a0;
  acStack_7a0[8] = '\0';
  acStack_7a0[9] = '\0';
  acStack_7a0[10] = '\0';
  acStack_7a0[0xb] = '\0';
  acStack_7a0[0xc] = '\0';
  acStack_7a0[0xd] = '\0';
  acStack_7a0[0xe] = '@';
  acStack_7a0[0xf] = '0';
  acStack_7a0[0] = '\v';
  acStack_7a0[1] = '\0';
  acStack_7a0[2] = '\0';
  acStack_7a0[3] = '\0';
  acStack_7a0[4] = '\0';
  acStack_7a0[5] = '\0';
  acStack_7a0[6] = '\0';
  acStack_7a0[7] = '\0';
  pcStack_7b0 = (code *)0x1331ce;
  pcStack_790 = (char *)__n;
  pcStack_788 = (code *)unaff_R14;
  plVar6 = (long *)bson_new();
  pcStack_7b0 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar6,"decimal128",0xffffffff,pcVar7);
  if (cVar1 == '\0') {
    pcStack_7b0 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_7b0 = (code *)0x1331f7;
    pcVar7 = (char *)bson_as_json(plVar6,auStack_7a8);
    if (pcVar7 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_7b0 = (code *)0x133221;
      bson_free(pcVar7);
      pcStack_7b0 = (code *)0x133229;
      bson_destroy(plVar6);
      return;
    }
    pcStack_7b0 = (code *)0x133215;
    iVar2 = strcmp(pcVar7,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_7b0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar16 = &pcStack_7b0;
  pcStack_c08 = (code *)0x133271;
  plStack_7b8 = plVar6;
  pcStack_7b0 = (code *)&pcStack_388;
  cVar1 = bson_init_from_json(auStack_b00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_a18);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_c08 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_b80,auStack_b00);
  if (cVar1 == '\0') {
    pcStack_c08 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_c08 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_c08 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_c08 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_c08 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_b80,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_c08 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_b80);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar6 = &lStack_b90;
    pcStack_c08 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_b80,plVar6);
    if (lStack_b90 != 0xb) goto LAB_0013330b;
    if (lStack_b88 == 0x3040000000000000) {
      pcStack_c08 = (code *)0x1332f5;
      bson_destroy(auStack_b00);
      return;
    }
  }
  pcStack_c08 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_c08 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar14 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar15 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_c20 = plVar6;
  uStack_c18 = unaff_R12;
  pcStack_c10 = pcVar7;
  pcStack_c08 = (code *)unaff_R15;
  do {
    pcStack_e30 = (code *)0x133357;
    lVar8 = bson_new_from_json(pcVar14,0xffffffffffffffff,&iStack_e20);
    if (lVar8 != 0) {
      pcStack_e30 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_e30 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_e18,
              unaff_R15);
      pcStack_e30 = (code *)0x1333c7;
      abort();
    }
    if (iStack_e20 != 1) {
LAB_001333cc:
      pcStack_e30 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_1048 = (code *)0x1333f1;
      pcStack_e38 = acStack_e18;
      pcStack_e30 = (code *)&iStack_e20;
      pcVar7 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_1038);
      pcStack_1048 = (code *)0x1333fe;
      pcVar14 = (char *)bson_as_json(pcVar7,0);
      if (pcVar14 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_1048 = (code *)0x133428;
        bson_free(pcVar14);
        pcStack_1048 = (code *)0x133430;
        bson_destroy(pcVar7);
        return;
      }
      pcStack_1048 = (code *)0x13341c;
      iVar2 = strcmp(pcVar14,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_1048 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_1258 = 0x2200223a2261227b;
      uStack_1250 = 0x7d;
      uStack_125c = 0x227b;
      pcStack_1048 = (code *)pcVar7;
      lVar8 = bson_new_from_json(&uStack_1258,9,&iStack_1248);
      if (lVar8 == 0) {
        if (iStack_1248 != 1) goto LAB_001334fc;
        if (iStack_1244 != 1) goto LAB_00133501;
        pcVar7 = acStack_1240;
        pcVar9 = strstr(pcVar7,"Got parse error");
        if (pcVar9 == (char *)0x0) goto LAB_00133506;
        lVar8 = bson_new_from_json(&uStack_125c,3,&iStack_1248);
        if (lVar8 != 0) goto LAB_001334f7;
        if (iStack_1248 != 1) goto LAB_0013350e;
        if (iStack_1244 == 1) {
          pcVar9 = strstr(pcVar7,"Got parse error");
          if (pcVar9 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar4 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar5 = bson_bcon_magic();
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0,uVar4,pcVar7,ppuVar15,unaff_R13,pcVar14,unaff_R15,
                       ppcVar16);
      uVar10 = bcon_new(0,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar4,uVar10,0);
      uVar4 = bson_new();
      uVar10 = bson_new();
      uVar11 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar4,uVar10,uVar11,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar4,0);
      uVar4 = bson_new();
      _test_json_produces_multiple("[]",0,uVar4,0);
      uVar4 = bcon_new(0,"0","{","x",uVar5,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar4,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_e1c != 2) {
      pcStack_e30 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    unaff_R15 = ppuVar15[-1];
    pcStack_e30 = (code *)0x13337e;
    pcVar7 = strstr(acStack_e18,unaff_R15);
    if (pcVar7 == (char *)0x0) goto LAB_001333a4;
    pcVar14 = *ppuVar15;
    ppuVar15 = ppuVar15 + 2;
    if (pcVar14 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
test_bson_json_null (void)
{
   bson_error_t error;
   bson_t b;

   const char *json = "{ \"x\": null }";
   BSON_ASSERT (bson_init_from_json (&b, json, -1, &error));
   BSON_ASSERT (BCON_EXTRACT (&b, "x", BCONE_NULL));
   bson_destroy (&b);
}